

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

uchar duckdb::TryCastCInternal<char*,unsigned_char,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  uchar uVar2;
  undefined8 in_RAX;
  uchar result_value;
  uchar local_1;
  
  local_1 = (uchar)((ulong)in_RAX >> 0x38);
  bVar1 = FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,unsigned_char>
                    (*(char **)((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_1);
  uVar2 = '\0';
  if (bVar1) {
    uVar2 = local_1;
  }
  return uVar2;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}